

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint32 flags)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  mz_zip_internal_state *pmVar5;
  uint *puVar6;
  void *pvVar7;
  void *pvVar8;
  byte bVar9;
  mz_bool mVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  int iVar20;
  mz_uint32 t;
  int iVar21;
  uint uVar22;
  uint uVar23;
  size_t sVar24;
  mz_uint64 mVar25;
  ulong uVar26;
  bool bVar27;
  mz_uint32 buf_u32 [1024];
  
  uVar19 = pZip->m_archive_size;
  if (uVar19 < 0x16) {
    return 0;
  }
  mVar25 = uVar19 - 0x1000;
  if ((long)uVar19 < 0x1001) {
    mVar25 = 0;
  }
LAB_0038fc4c:
  sVar24 = uVar19 - mVar25;
  if (0xfff < sVar24) {
    sVar24 = 0x1000;
  }
  sVar14 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar25,buf_u32,sVar24);
  if (sVar14 != sVar24) {
    return 0;
  }
  uVar23 = (int)sVar24 - 4;
  do {
    if ((int)uVar23 < 0) goto LAB_0038fc87;
    uVar19 = (ulong)uVar23;
    uVar23 = uVar23 - 1;
  } while (*(int *)((long)buf_u32 + uVar19) != 0x6054b50);
  sVar24 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar25 + uVar19,buf_u32,0x16);
  if (sVar24 != 0x16) {
    return 0;
  }
  if (buf_u32[0] != 0x6054b50) {
    return 0;
  }
  pZip->m_total_files = (uint)buf_u32[2]._2_2_;
  if ((uint)buf_u32[2]._2_2_ != (uint)(ushort)buf_u32[2]) {
    return 0;
  }
  if (buf_u32[1]._2_2_ != 0 || (short)buf_u32[1] != 0) {
    if ((short)buf_u32[1] != 1) {
      return 0;
    }
    if (buf_u32[1]._2_2_ != 1) {
      return 0;
    }
  }
  if (buf_u32[3] < (uint)buf_u32[2]._2_2_ * 0x2e) {
    return 0;
  }
  uVar19 = (ulong)buf_u32[4];
  uVar17 = (ulong)buf_u32[3];
  if (pZip->m_archive_size < uVar19 + uVar17) {
    return 0;
  }
  pZip->m_central_directory_file_ofs = uVar19;
  if (buf_u32[2]._2_2_ == 0) {
    uVar19 = 0;
  }
  else {
    pmVar5 = pZip->m_pState;
    if (((pmVar5->m_central_dir).m_capacity < uVar17) &&
       (mVar10 = mz_zip_array_ensure_capacity(pZip,&pmVar5->m_central_dir,uVar17,0), mVar10 == 0)) {
      return 0;
    }
    (pmVar5->m_central_dir).m_size = uVar17;
    pmVar5 = pZip->m_pState;
    uVar16 = (ulong)pZip->m_total_files;
    if (((pmVar5->m_central_dir_offsets).m_capacity < uVar16) &&
       (mVar10 = mz_zip_array_ensure_capacity(pZip,&pmVar5->m_central_dir_offsets,uVar16,0),
       mVar10 == 0)) {
      return 0;
    }
    (pmVar5->m_central_dir_offsets).m_size = uVar16;
    if ((flags >> 0xb & 1) == 0) {
      pmVar5 = pZip->m_pState;
      uVar16 = (ulong)pZip->m_total_files;
      if (((pmVar5->m_sorted_central_dir_offsets).m_capacity < uVar16) &&
         (mVar10 = mz_zip_array_ensure_capacity(pZip,&pmVar5->m_sorted_central_dir_offsets,uVar16,0)
         , mVar10 == 0)) {
        return 0;
      }
      (pmVar5->m_sorted_central_dir_offsets).m_size = uVar16;
    }
    sVar24 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar19,(pZip->m_pState->m_central_dir).m_p,uVar17);
    if (sVar24 != uVar17) {
      return 0;
    }
    piVar15 = (int *)(pZip->m_pState->m_central_dir).m_p;
    for (uVar17 = 0; uVar19 = (ulong)pZip->m_total_files, uVar17 < uVar19; uVar17 = uVar17 + 1) {
      if (buf_u32[3] < 0x2e) {
        return 0;
      }
      if (*piVar15 != 0x2014b50) {
        return 0;
      }
      *(int *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + uVar17 * 4) =
           (int)piVar15 - *(int *)&(pZip->m_pState->m_central_dir).m_p;
      if ((flags >> 0xb & 1) == 0) {
        *(int *)((long)(pZip->m_pState->m_sorted_central_dir_offsets).m_p + uVar17 * 4) =
             (int)uVar17;
      }
      uVar23 = piVar15[5];
      uVar22 = piVar15[6];
      if ((*(int *)((long)piVar15 + 10) == 0) && (uVar22 != uVar23)) {
        return 0;
      }
      if (uVar22 == 0xffffffff) {
        return 0;
      }
      if (uVar22 != 0 && uVar23 == 0) {
        return 0;
      }
      if (uVar23 == 0xffffffff) {
        return 0;
      }
      if (*(short *)((long)piVar15 + 0x22) != (short)buf_u32[1] &&
          *(short *)((long)piVar15 + 0x22) != 1) {
        return 0;
      }
      if (pZip->m_archive_size < (ulong)uVar23 + (ulong)*(uint *)((long)piVar15 + 0x2a) + 0x1e) {
        return 0;
      }
      uVar23 = (uint)*(ushort *)(piVar15 + 8) +
               (uint)*(ushort *)((long)piVar15 + 0x1e) + (uint)*(ushort *)(piVar15 + 7) + 0x2e;
      bVar27 = buf_u32[3] < uVar23;
      buf_u32[3] = buf_u32[3] - uVar23;
      if (bVar27) {
        return 0;
      }
      piVar15 = (int *)((long)piVar15 + (ulong)uVar23);
    }
  }
  if ((flags >> 0xb & 1) == 0) {
    pmVar5 = pZip->m_pState;
    puVar6 = (uint *)(pmVar5->m_sorted_central_dir_offsets).m_p;
    iVar20 = (int)uVar19;
    for (iVar11 = iVar20 + -2 >> 1; iVar13 = iVar11, -1 < iVar11; iVar11 = iVar11 + -1) {
      while (iVar21 = iVar13 * 2 + 1, iVar21 < iVar20) {
        iVar12 = iVar13 * 2 + 2;
        uVar23 = 0;
        pvVar7 = (pmVar5->m_central_dir).m_p;
        pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
        if (iVar12 < iVar20) {
          uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar21] * 4);
          uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar12] * 4);
          uVar3 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
          uVar23 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar23 = (uint)uVar3;
          }
          bVar18 = 0;
          for (uVar26 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar26 + uVar16 + 0x2e), bVar9 = bVar18,
              pbVar1 < (byte *)((long)pvVar7 + uVar23 + uVar16 + 0x2e); uVar26 = uVar26 + 1) {
            bVar18 = *pbVar1;
            bVar9 = bVar18 + 0x20;
            if (0x19 < (byte)(bVar18 + 0xbf)) {
              bVar9 = bVar18;
            }
            bVar2 = *(byte *)((long)pvVar7 + uVar26 + uVar17 + 0x2e);
            bVar18 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar18 = bVar2;
            }
            if (bVar9 != bVar18) break;
            bVar18 = bVar9;
          }
          bVar27 = bVar9 < bVar18;
          if (uVar23 == uVar26) {
            bVar27 = uVar3 < uVar4;
          }
          uVar23 = (uint)bVar27;
        }
        iVar21 = uVar23 + iVar21;
        uVar23 = puVar6[iVar13];
        uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar23 * 4);
        uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar21] * 4);
        uVar3 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
        uVar22 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar22 = (uint)uVar3;
        }
        bVar18 = 0;
        for (uVar26 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar26 + uVar17 + 0x2e), bVar9 = bVar18,
            pbVar1 < (byte *)((long)pvVar7 + uVar22 + uVar17 + 0x2e); uVar26 = uVar26 + 1) {
          bVar9 = *pbVar1;
          bVar18 = bVar9 + 0x20;
          if (0x19 < (byte)(bVar9 + 0xbf)) {
            bVar18 = bVar9;
          }
          bVar2 = *(byte *)((long)pvVar7 + uVar26 + uVar16 + 0x2e);
          bVar9 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar9 = bVar2;
          }
          if (bVar18 != bVar9) break;
        }
        bVar27 = bVar9 <= bVar18;
        if (uVar22 == uVar26) {
          bVar27 = uVar4 <= uVar3;
        }
        if (bVar27) break;
        puVar6[iVar13] = puVar6[iVar21];
        puVar6[iVar21] = uVar23;
        iVar13 = iVar21;
      }
    }
LAB_003900f4:
    if (1 < (int)uVar19) {
      uVar19 = uVar19 - 1;
      uVar23 = puVar6[uVar19 & 0xffffffff];
      puVar6[uVar19 & 0xffffffff] = *puVar6;
      *puVar6 = uVar23;
      iVar20 = 0;
      while( true ) {
        iVar11 = iVar20 * 2 + 1;
        if ((int)uVar19 <= iVar11) break;
        iVar13 = iVar20 * 2 + 2;
        uVar22 = 0;
        pvVar7 = (pmVar5->m_central_dir).m_p;
        pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
        if (iVar13 < (int)uVar19) {
          uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar11] * 4);
          uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar13] * 4);
          uVar3 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
          uVar4 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
          uVar22 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar22 = (uint)uVar3;
          }
          bVar18 = 0;
          for (uVar26 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar26 + uVar16 + 0x2e), bVar9 = bVar18,
              pbVar1 < (byte *)((long)pvVar7 + uVar22 + uVar16 + 0x2e); uVar26 = uVar26 + 1) {
            bVar9 = *pbVar1;
            bVar18 = bVar9 + 0x20;
            if (0x19 < (byte)(bVar9 + 0xbf)) {
              bVar18 = bVar9;
            }
            bVar2 = *(byte *)((long)pvVar7 + uVar26 + uVar17 + 0x2e);
            bVar9 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar9 = bVar2;
            }
            if (bVar18 != bVar9) break;
          }
          bVar27 = bVar18 < bVar9;
          if (uVar22 == uVar26) {
            bVar27 = uVar3 < uVar4;
          }
          uVar22 = (uint)bVar27;
        }
        iVar11 = uVar22 + iVar11;
        uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar23 * 4);
        uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)puVar6[iVar11] * 4);
        uVar3 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
        uVar4 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
        uVar22 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar22 = (uint)uVar3;
        }
        bVar18 = 0;
        for (uVar26 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar26 + uVar17 + 0x2e), bVar9 = bVar18,
            pbVar1 < (byte *)((long)pvVar7 + uVar22 + uVar17 + 0x2e); uVar26 = uVar26 + 1) {
          bVar18 = *pbVar1;
          bVar9 = bVar18 + 0x20;
          if (0x19 < (byte)(bVar18 + 0xbf)) {
            bVar9 = bVar18;
          }
          bVar2 = *(byte *)((long)pvVar7 + uVar26 + uVar16 + 0x2e);
          bVar18 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar18 = bVar2;
          }
          if (bVar9 != bVar18) break;
          bVar18 = bVar9;
        }
        bVar27 = bVar18 <= bVar9;
        if (uVar22 == uVar26) {
          bVar27 = uVar4 <= uVar3;
        }
        if (bVar27) break;
        puVar6[iVar20] = puVar6[iVar11];
        puVar6[iVar11] = uVar23;
        iVar20 = iVar11;
      }
      goto LAB_003900f4;
    }
  }
  return 1;
LAB_0038fc87:
  if (mVar25 == 0) {
    return 0;
  }
  uVar19 = pZip->m_archive_size;
  uVar17 = uVar19 - mVar25;
  mVar25 = mVar25 - 0xffd;
  if (0x10014 < uVar17) {
    return 0;
  }
  goto LAB_0038fc4c;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint32 flags) {
  mz_uint cdir_size, num_this_disk, cdir_disk_index;
  mz_uint64 cdir_ofs;
  mz_int64 cur_file_ofs;
  const mz_uint8 *p;
  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  // Basic sanity checks - reject files which are too small, and check the first
  // 4 bytes of the file to make sure a local header is there.
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  // Find the end of central directory record by scanning the file from the end
  // towards the beginning.
  cur_file_ofs =
      MZ_MAX((mz_int64)pZip->m_archive_size - (mz_int64)sizeof(buf_u32), 0);
  for (;;) {
    int i,
        n = (int)MZ_MIN(sizeof(buf_u32), pZip->m_archive_size - cur_file_ofs);
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, n) != (mz_uint)n)
      return MZ_FALSE;
    for (i = n - 4; i >= 0; --i)
      if (MZ_READ_LE32(pBuf + i) == MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        break;
    if (i >= 0) {
      cur_file_ofs += i;
      break;
    }
    if ((!cur_file_ofs) || ((pZip->m_archive_size - cur_file_ofs) >=
                            (0xFFFF + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)))
      return MZ_FALSE;
    cur_file_ofs = MZ_MAX(cur_file_ofs - (sizeof(buf_u32) - 3), 0);
  }
  // Read and verify the end of central directory record.
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if ((MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
       MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG) ||
      ((pZip->m_total_files =
            MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS)) !=
       MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS)))
    return MZ_FALSE;

  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return MZ_FALSE;

  if ((cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS)) <
      pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;

  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);
  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
    return MZ_FALSE;

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;

    // Read the entire central directory into a heap block, and allocate another
    // heap block to hold the unsorted central dir file record offsets, and
    // another to hold the sorted indices.
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return MZ_FALSE;

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return MZ_FALSE;
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return MZ_FALSE;

    // Now create an index into the central directory file records, do some
    // basic sanity checking on each record, and check for zip64 entries (which
    // are not yet supported).
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, comp_size, decomp_size, disk_index;
      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return MZ_FALSE;
      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);
      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;
      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
           (decomp_size != comp_size)) ||
          (decomp_size && !comp_size) || (decomp_size == 0xFFFFFFFF) ||
          (comp_size == 0xFFFFFFFF))
        return MZ_FALSE;
      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index != num_this_disk) && (disk_index != 1))
        return MZ_FALSE;
      if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
           MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
        return MZ_FALSE;
      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return MZ_FALSE;
      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}